

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void store_maint(store *s)

{
  byte bVar1;
  object *poVar2;
  object_kind *k;
  _Bool _Var3;
  uint32_t uVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  bool bVar7;
  wchar_t max_1;
  wchar_t min_1;
  wchar_t stock_1;
  wchar_t restock_attempts_1;
  object *obj_1;
  object_kind *kind;
  size_t i;
  wchar_t sales;
  wchar_t max;
  wchar_t min;
  wchar_t stock;
  wchar_t restock_attempts;
  object *next;
  object *obj;
  store *s_local;
  
  _Var3 = store_is_home(s);
  if (!_Var3) {
    _Var3 = store_is_black_market(s);
    if (_Var3) {
      poVar2 = s->stock;
      while (next = poVar2, next != (object *)0x0) {
        poVar2 = next->next;
        _Var3 = black_market_ok(s->town,next);
        if (!_Var3) {
          if (next->artifact != (artifact *)0x0) {
            history_lose_artifact(player,next->artifact);
          }
          store_delete(s,next,(uint)next->number);
        }
      }
    }
    if (s->turnover == L'\0') {
      if ((s->always_num != 0) && (s->stock_num != '\0')) {
        uVar4 = Rand_div((uint)s->stock_num);
        i._4_4_ = uVar4 + 1;
        while (i._4_4_ != 0) {
          store_delete_random(s);
          i._4_4_ = i._4_4_ + -1;
        }
      }
    }
    else {
      min = L'𘚠';
      bVar1 = s->stock_num;
      uVar4 = Rand_div(s->turnover);
      max = (uint)bVar1 - (uVar4 + 1);
      if (max < L'\0') {
        max = L'\0';
      }
      if (s->normal_stock_max < max) {
        max = s->normal_stock_max;
      }
      while( true ) {
        bVar7 = false;
        if (max < (int)(uint)s->stock_num) {
          min = min + L'\xffffffff';
          bVar7 = min != L'\0';
        }
        if (!bVar7) break;
        store_delete_random(s);
      }
      if (min == L'\0') {
        quit_fmt("Unable to (de-)stock store %d. Please report this bug",(ulong)(s->sidx + 1));
      }
    }
    if (s->always_num != 0) {
      for (kind = (object_kind *)0x0; kind < (object_kind *)s->always_num;
          kind = (object_kind *)((long)&kind->name + 1)) {
        k = s->always_table[(long)kind];
        _stock_1 = store_find_kind(s,k,store_sale_should_reduce_stock);
        if ((_stock_1 != (object *)0x0) ||
           (_stock_1 = store_create_item(s,k), _stock_1 != (object *)0x0)) {
          _stock_1->number = (uint8_t)_stock_1->kind->base->max_stack;
          _stock_1->known->number = (uint8_t)_stock_1->kind->base->max_stack;
        }
      }
    }
    if (s->turnover != L'\0') {
      min_1 = L'𘚠';
      bVar1 = s->stock_num;
      uVar4 = Rand_div(s->turnover);
      max_1 = (uint)bVar1 + uVar4 + 1;
      wVar5 = s->normal_stock_min + (int)s->always_num;
      wVar6 = s->normal_stock_max + (int)s->always_num;
      if (wVar6 < max_1) {
        max_1 = wVar6;
      }
      if (max_1 < wVar5) {
        max_1 = wVar5;
      }
      while( true ) {
        bVar7 = false;
        if ((int)(uint)s->stock_num < max_1) {
          min_1 = min_1 + L'\xffffffff';
          bVar7 = min_1 != L'\0';
        }
        if (!bVar7) break;
        store_create_random(s);
      }
      if (min_1 == L'\0') {
        quit_fmt("Unable to (re-)stock store %d. Please report this bug",(ulong)(s->sidx + 1));
      }
    }
  }
  return;
}

Assistant:

static void store_maint(struct store *s)
{
	/* Ignore home */
	if (store_is_home(s))
		return;

	/* Destroy crappy black market items */
	if (store_is_black_market(s)) {
		struct object *obj = s->stock;
		while (obj) {
			struct object *next = obj->next;
			if (!black_market_ok(s->town, obj)) {
				if (obj->artifact) {
					history_lose_artifact(player,
										  obj->artifact);
				}
				store_delete(s, obj, obj->number);
			}
			obj = next;
		}
	}

	/* We want to make sure stores have staple items. If there's
	 * turnover, we also want to delete a few items, and add a few
	 * items.
	 *
	 * If we create staple items, then delete items, then create new
	 * items, we are stuck with one of three choices:
	 * 1. We can risk deleting staple items, and not having any left.
	 * 2. We can refuse to delete staple items, and risk having that
	 * become an infinite loop.
	 * 3. We can do a ton of extra bookkeeping to make sure we delete
	 * staple items only if there's duplicates of them.
	 *
	 * What if we change the order? First sell a handful of random items,
	 * then create any missing staples, then create new items. This
	 * has two tests for s->turnover, but simplifies everything else
	 * dramatically.
	 */

	if (s->turnover) {
		int restock_attempts = 100000;
		int stock = s->stock_num - randint1(s->turnover);

		/* We'll end up adding staples for sure, maybe plus other
		 * items. It's fine if we sell out completely, though, if
		 * turnover is high. The cap doesn't include always_num,
		 * because otherwise the addition of missing staples could
		 * put us over (if the store was full of player-sold loot).
		 */
		int min = 0;
		int max = s->normal_stock_max;

		if (stock < min) stock = min;
		if (stock > max) stock = max;

		/* Destroy random objects until only "stock" slots are left */
		while (s->stock_num > stock && --restock_attempts)
			store_delete_random(s);

		if (!restock_attempts)
			quit_fmt("Unable to (de-)stock store %d. Please report this bug",
					 s->sidx + 1);
	} else {
		/* For the Bookseller, occasionally sell a book */
		if (s->always_num && s->stock_num) {
			int sales = randint1(s->stock_num);
			while (sales--) {
				store_delete_random(s);
			}
		}
	}

	/* Ensure staples are created */
	if (s->always_num) {
		size_t i;
		for (i = 0; i < s->always_num; i++) {
			struct object_kind *kind = s->always_table[i];
			struct object *obj = store_find_kind(s, kind,
				store_sale_should_reduce_stock);

			/* Create the item if it doesn't exist */
			if (!obj) {
				obj = store_create_item(s, kind);
				if (!obj) continue;
			}

			/* Ensure a full stack */
			obj->number = obj->kind->base->max_stack;
			obj->known->number = obj->kind->base->max_stack;
		}
	}

	if (s->turnover) {
		int restock_attempts = 100000;
		int stock = s->stock_num + randint1(s->turnover);

		/* Now that the staples exist, we want to add more
		 * items, at least enough to get us to normal_stock_min
		 * items that aren't necessarily staples.
		 */

		int min = s->normal_stock_min + s->always_num;
		int max = s->normal_stock_max + s->always_num;

		/* Buy a few items */

		/* Keep stock between specified min and max slots */
		if (stock > max) stock = max;
		if (stock < min) stock = min;

		/* For the rest, we just choose items randomlyish */
		/* The (huge) restock_attempts will only go to zero (otherwise
		 * infinite loop) if stores don't have enough items they can stock! */
		while (s->stock_num < stock && --restock_attempts)
			store_create_random(s);

		if (!restock_attempts)
			quit_fmt("Unable to (re-)stock store %d. Please report this bug",
					 s->sidx + 1);
	}
}